

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cc
# Opt level: O0

void __thiscall tt::LogFile::flush(LogFile *this)

{
  bool bVar1;
  type mutex;
  pointer pAVar2;
  MutexLockGuard local_18;
  MutexLockGuard lock;
  LogFile *this_local;
  
  lock.m_mutex = (MutexLock *)this;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_mutex);
  if (bVar1) {
    mutex = std::unique_ptr<tt::MutexLock,_std::default_delete<tt::MutexLock>_>::operator*
                      (&this->m_mutex);
    MutexLockGuard::MutexLockGuard(&local_18,mutex);
    pAVar2 = std::
             unique_ptr<tt::FileUtil::AppendFile,_std::default_delete<tt::FileUtil::AppendFile>_>::
             operator->(&this->m_file);
    FileUtil::AppendFile::flush(pAVar2);
    MutexLockGuard::~MutexLockGuard(&local_18);
  }
  else {
    pAVar2 = std::
             unique_ptr<tt::FileUtil::AppendFile,_std::default_delete<tt::FileUtil::AppendFile>_>::
             operator->(&this->m_file);
    FileUtil::AppendFile::flush(pAVar2);
  }
  return;
}

Assistant:

void tt::LogFile::flush(){
	if(m_mutex){
		MutexLockGuard lock(*m_mutex);
		m_file->flush();
	}else{
		m_file->flush();
	}
}